

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O1

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  long lVar1;
  long lVar2;
  char *extraout_RAX;
  char *pcVar3;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  long lVar4;
  undefined4 in_register_00000034;
  char *local_78;
  undefined8 local_70;
  char local_68;
  undefined7 uStack_67;
  ASTPrinter *local_58;
  string local_50;
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = '\0';
  lVar1 = *(long *)(CONCAT44(in_register_00000034,__fd) + 0x48);
  local_58 = this;
  if (lVar1 != 0) {
    lVar2 = *(long *)(CONCAT44(in_register_00000034,__fd) + 0x40);
    lVar4 = 0;
    do {
      escape_abi_cxx11_(&local_50,(lang *)(ulong)(uint)(int)*(char *)(lVar2 + lVar4),(char)__addr);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
      __addr = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        __addr = extraout_RDX_00;
      }
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  printf<char_const*>(local_58,"StringExpr: \"%s\"\n",local_78);
  pcVar3 = &local_68;
  if (local_78 != pcVar3) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    pcVar3 = extraout_RAX;
  }
  return (int)pcVar3;
}

Assistant:

void ASTPrinter::accept(StringExpr& string) {
  printf("StringExpr: \"%s\"\n", escape(string.value()).c_str());
}